

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O1

AActor * __thiscall FActorIterator::Next(FActorIterator *this)

{
  uint uVar1;
  AActor *pAVar2;
  AActor **ppAVar3;
  
  uVar1 = this->id;
  if (uVar1 == 0) {
    pAVar2 = (AActor *)0x0;
  }
  else {
    ppAVar3 = &this->base->inext;
    if (this->base == (AActor *)0x0) {
      ppAVar3 = (AActor **)((long)AActor::TIDHash + (ulong)((uVar1 & 0x7f) << 3));
    }
    for (pAVar2 = *ppAVar3; (this->base = pAVar2, pAVar2 != (AActor *)0x0 && (pAVar2->tid != uVar1))
        ; pAVar2 = pAVar2->inext) {
    }
  }
  return pAVar2;
}

Assistant:

AActor *Next ()
	{
		if (id == 0)
			return NULL;
		if (!base)
			base = AActor::TIDHash[id & 127];
		else
			base = base->inext;

		while (base && base->tid != id)
			base = base->inext;

		return base;
	}